

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

uint16_t netaddr_socket_get_port(netaddr_socket *sock)

{
  if (((sock->v4).sin_family | 8) == 10) {
    return (sock->v4).sin_port << 8 | (sock->v4).sin_port >> 8;
  }
  return 0;
}

Assistant:

uint16_t
netaddr_socket_get_port(const union netaddr_socket *sock) {
  switch (sock->std.sa_family) {
    case AF_INET:
      return ntohs(sock->v4.sin_port);
    case AF_INET6:
      return ntohs(sock->v6.sin6_port);
    default:
      return 0;
  }
}